

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O2

void __thiscall
CLogicSocket::procPingTimeOutChecking(CLogicSocket *this,LPSTRUC_MSG_HEADER tmpmsg,time_t cur_time)

{
  lp_connection_t p_Conn;
  CMemory *this_00;
  SourceFile file;
  undefined1 local_1010 [12];
  Logger local_1000;
  
  this_00 = CMemory::GetInstance();
  p_Conn = tmpmsg->pConn;
  if (tmpmsg->iCurrsequence == p_Conn->iCurrsequence) {
    if ((long)(this->super_CSocekt).m_iWaitTime * 3 + 10 < cur_time - p_Conn->lastPingTime) {
      if (muduo::g_logLevel < 3) {
        muduo::Logger::SourceFile::SourceFile<101>
                  ((SourceFile *)local_1010,
                   (char (*) [101])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/logic/flyd_logic.cc"
                  );
        file._12_4_ = 0;
        file.data_ = (char *)local_1010._0_8_;
        file.size_ = local_1010._8_4_;
        muduo::Logger::Logger(&local_1000,file,0x115);
        muduo::LogStream::operator<<(&local_1000.impl_.stream_,anon_var_dwarf_36d27);
        muduo::Logger::~Logger(&local_1000);
      }
      CSocekt::zdClosesocketProc(&this->super_CSocekt,p_Conn);
    }
    CMemory::FreeMemory(this_00,tmpmsg);
    return;
  }
  CMemory::FreeMemory(this_00,tmpmsg);
  return;
}

Assistant:

void CLogicSocket::procPingTimeOutChecking(LPSTRUC_MSG_HEADER tmpmsg,time_t cur_time)
{
    CMemory *p_memory = CMemory::GetInstance();

    if(tmpmsg->iCurrsequence == tmpmsg->pConn->iCurrsequence) //此连接没断
    {
        lp_connection_t p_Conn = tmpmsg->pConn;

        //超时踢的判断标准就是 每次检查的时间间隔*3，超过这个时间没发送心跳包，就踢【大家可以根据实际情况自由设定】
        if( (cur_time - p_Conn->lastPingTime ) > (m_iWaitTime * 3 + 10) )
        {
            //踢出去【如果此时此刻该用户正好断线，则这个socket可能立即被后续上来的连接复用  如果真有人这么倒霉，赶上这个点了，那么可能错踢，错踢就错踢】            
            LOG_INFO << "时间到不发心跳包，踢出去!";   //感觉OK
            zdClosesocketProc(p_Conn); 
        }   
             
        p_memory->FreeMemory(tmpmsg);//内存要释放
    }
    else //此连接断了
    {
        p_memory->FreeMemory(tmpmsg);//内存要释放
    }
    return;
}